

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenI31Get(BinaryenModuleRef module,BinaryenExpressionRef i31,bool signed_)

{
  I31Get *pIVar1;
  Builder local_28;
  byte local_19;
  BinaryenExpressionRef pEStack_18;
  bool signed__local;
  BinaryenExpressionRef i31_local;
  BinaryenModuleRef module_local;
  
  local_19 = signed_;
  pEStack_18 = i31;
  i31_local = (BinaryenExpressionRef)module;
  wasm::Builder::Builder(&local_28,module);
  pIVar1 = wasm::Builder::makeI31Get(&local_28,pEStack_18,(local_19 & 1) != 0);
  return (BinaryenExpressionRef)pIVar1;
}

Assistant:

BinaryenExpressionRef BinaryenI31Get(BinaryenModuleRef module,
                                     BinaryenExpressionRef i31,
                                     bool signed_) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeI31Get((Expression*)i31, signed_ != 0));
}